

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O0

string * __thiscall
glcts::GeometryShaderMaxImageUniformsTest::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderMaxImageUniformsTest *this)

{
  ostream *poVar1;
  char *local_1e0;
  char *gs_code_raw;
  string gs_code;
  int local_1b0;
  GLint n_img_1;
  GLint n_img;
  stringstream local_1a0 [8];
  stringstream code_sstream;
  ostream local_190;
  GeometryShaderMaxImageUniformsTest *local_18;
  GeometryShaderMaxImageUniformsTest *this_local;
  string *gs_code_specialized;
  
  local_18 = this;
  this_local = (GeometryShaderMaxImageUniformsTest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,
                  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nprecision highp iimage2D;\n\nivec4 counter = ivec4(0);\n\n"
                 );
  for (local_1b0 = 0; local_1b0 < this->m_gl_max_geometry_image_uniforms_ext_value;
      local_1b0 = local_1b0 + 1) {
    poVar1 = std::operator<<(&local_190,"layout(binding = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b0);
    poVar1 = std::operator<<(poVar1,", r32i) uniform iimage2D img");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b0);
    std::operator<<(poVar1,";\n");
  }
  std::operator<<(&local_190,"\nvoid main()\n{\n");
  for (gs_code.field_2._12_4_ = 0;
      (int)gs_code.field_2._12_4_ < this->m_gl_max_geometry_image_uniforms_ext_value;
      gs_code.field_2._12_4_ = gs_code.field_2._12_4_ + 1) {
    poVar1 = std::operator<<(&local_190,"    counter += imageLoad(img");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,gs_code.field_2._12_4_);
    std::operator<<(poVar1,", ivec2(0, 0));\n");
  }
  std::operator<<(&local_190,
                  "\n    gl_Position = vec4(float(counter.x), 0.0, 0.0, 1.0);\n    EmitVertex();\n}\n"
                 );
  std::__cxx11::stringstream::str();
  local_1e0 = (char *)std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            (__return_storage_ptr__,&this->super_TestCaseBase,1,&local_1e0);
  std::__cxx11::string::~string((string *)&gs_code_raw);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderMaxImageUniformsTest::getGSCode()
{
	std::stringstream code_sstream;

	/* Form the GS */
	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout (points)                   in;\n"
					"layout (points, max_vertices = 1) out;\n"
					"\n"
					"precision highp iimage2D;\n"
					"\n"
					"ivec4 counter = ivec4(0);\n"
					"\n";

	for (glw::GLint n_img = 0; n_img < (m_gl_max_geometry_image_uniforms_ext_value); ++n_img)
	{
		code_sstream << "layout(binding = " << n_img << ", r32i) uniform iimage2D img" << n_img << ";\n";
	}

	code_sstream << "\n"
					"void main()\n"
					"{\n";

	for (glw::GLint n_img = 0; n_img < (m_gl_max_geometry_image_uniforms_ext_value); ++n_img)
	{
		code_sstream << "    counter += imageLoad(img" << n_img << ", ivec2(0, 0));\n";
	}

	code_sstream << "\n"
					"    gl_Position = vec4(float(counter.x), 0.0, 0.0, 1.0);\n"
					"    EmitVertex();\n"
					"}\n";

	/* Form a specialized version of the GS source code */
	std::string gs_code				= code_sstream.str();
	const char* gs_code_raw			= gs_code.c_str();
	std::string gs_code_specialized = specializeShader(1 /* parts */, &gs_code_raw);

	return gs_code_specialized;
}